

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O1

void __thiscall
soul::heart::StructElement::StructElement
          (StructElement *this,CodeLocation *l,Expression *v,string *member)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  bool bVar7;
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Structure *this_00;
  string_view memberName;
  CodeLocation local_30;
  
  local_30.sourceCode.object = (l->sourceCode).object;
  (l->sourceCode).object = (SourceCodeText *)0x0;
  local_30.location.data = (l->location).data;
  Expression::Expression(&this->super_Expression,&local_30);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_30.sourceCode.object);
  (this->super_Expression).super_Object._vptr_Object = (_func_int **)&PTR__StructElement_003072d8;
  (this->parent).object = v;
  paVar1 = &(this->memberName).field_2;
  (this->memberName)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (member->_M_dataplus)._M_p;
  paVar2 = &member->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined4 *)((long)&member->field_2 + 4);
    uVar5 = *(undefined4 *)((long)&member->field_2 + 8);
    uVar6 = *(undefined4 *)((long)&member->field_2 + 0xc);
    *(undefined4 *)paVar1 = *(undefined4 *)paVar2;
    *(undefined4 *)((long)&(this->memberName).field_2 + 4) = uVar4;
    *(undefined4 *)((long)&(this->memberName).field_2 + 8) = uVar5;
    *(undefined4 *)((long)&(this->memberName).field_2 + 0xc) = uVar6;
  }
  else {
    (this->memberName)._M_dataplus._M_p = pcVar3;
    (this->memberName).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->memberName)._M_string_length = member->_M_string_length;
  (member->_M_dataplus)._M_p = (pointer)paVar2;
  member->_M_string_length = 0;
  (member->field_2)._M_local_buf[0] = '\0';
  iVar8 = (*(v->super_Object)._vptr_Object[2])(v);
  if (*(char *)CONCAT44(extraout_var,iVar8) == '\x06') {
    iVar8 = (*(v->super_Object)._vptr_Object[2])(v);
    this_00 = Type::getStructRef((Type *)CONCAT44(extraout_var_00,iVar8));
    memberName._M_str = (this->memberName)._M_dataplus._M_p;
    memberName._M_len = (this->memberName)._M_string_length;
    bVar7 = Structure::hasMemberWithName(this_00,memberName);
    if (bVar7) {
      return;
    }
  }
  throwInternalCompilerError
            ("v.getType().isStruct() && v.getType().getStructRef().hasMemberWithName (memberName)",
             "StructElement",0x283);
}

Assistant:

StructElement (CodeLocation l, Expression& v, std::string member)
           : Expression (std::move (l)), parent (v), memberName (std::move (member))
        {
            SOUL_ASSERT (v.getType().isStruct() && v.getType().getStructRef().hasMemberWithName (memberName));
        }